

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_memio.h
# Opt level: O2

bool __thiscall Kumu::MemIOReader::ReadUi8(MemIOReader *this,ui8_t *i)

{
  uint uVar1;
  uint uVar2;
  
  if (i != (ui8_t *)0x0) {
    uVar1 = this->m_capacity;
    uVar2 = this->m_size + 1;
    if (uVar2 <= uVar1) {
      *i = this->m_p[this->m_size];
      this->m_size = this->m_size + 1;
    }
    return uVar2 <= uVar1;
  }
  __assert_fail("i",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_memio.h"
                ,0xb0,"bool Kumu::MemIOReader::ReadUi8(ui8_t *)");
}

Assistant:

inline bool ReadUi8(ui8_t* i) {
	assert(i);
	if ( ( m_size + 1 ) > m_capacity )
	  return false;

	*i = *(m_p + m_size);
	m_size++;
	return true;
      }